

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestMemoryAllocator.cpp
# Opt level: O0

void __thiscall
AccountingTestMemoryAllocator::free_memory
          (AccountingTestMemoryAllocator *this,char *memory,size_t param_3,char *file,size_t line)

{
  MemoryAccountant *this_00;
  undefined8 in_RCX;
  undefined8 in_RSI;
  size_t in_RDI;
  AccountingTestMemoryAllocator *in_R8;
  size_t size;
  char *in_stack_ffffffffffffffd0;
  
  this_00 = (MemoryAccountant *)
            removeMemoryFromTrackingAndReturnAllocatedSize(in_R8,in_stack_ffffffffffffffd0);
  MemoryAccountant::dealloc(this_00,in_RDI);
  (**(code **)(**(long **)(in_RDI + 0x30) + 0x18))
            (*(long **)(in_RDI + 0x30),in_RSI,this_00,in_RCX,in_R8);
  return;
}

Assistant:

void AccountingTestMemoryAllocator::free_memory(char* memory, size_t, const char* file, size_t line)
{
    size_t size = removeMemoryFromTrackingAndReturnAllocatedSize(memory);
    accountant_.dealloc(size);
    originalAllocator_->free_memory(memory, size, file, line);
}